

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_3::UpdateHasbitSet(Printer *p,bool is_oneof)

{
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  undefined1 local_11;
  Printer *pPStack_10;
  bool is_oneof_local;
  Printer *p_local;
  
  local_11 = is_oneof;
  pPStack_10 = p;
  if (is_oneof) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,
               "\n    if ($not_has_field$) {\n      clear_$oneof_name$();\n\n      set_has_$name_internal$();\n      $field_$.InitDefault();\n    }\n  "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit(p,local_40._M_len,local_40._M_str);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"\n      $set_hasbit$;\n    ");
    io::Printer::SourceLocation::current();
    io::Printer::Emit(p,local_28._M_len,local_28._M_str);
  }
  return;
}

Assistant:

void UpdateHasbitSet(io::Printer* p, bool is_oneof) {
  if (!is_oneof) {
    p->Emit(R"cc(
      $set_hasbit$;
    )cc");
    return;
  }

  p->Emit(R"cc(
    if ($not_has_field$) {
      clear_$oneof_name$();

      set_has_$name_internal$();
      $field_$.InitDefault();
    }
  )cc");
}